

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O2

void __thiscall args::NamedBase::NamedBase(NamedBase *this,string *name_,string *help_)

{
  Base::Base(&this->super_Base,help_);
  (this->super_Base)._vptr_Base = (_func_int **)&PTR__NamedBase_001309e0;
  std::__cxx11::string::string((string *)&this->name,(string *)name_);
  this->kickout = false;
  return;
}

Assistant:

NamedBase(const std::string &name_, const std::string &help_) : Base(help_), name(name_), kickout(false) {}